

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sspm.cpp
# Opt level: O2

void __thiscall pg::SSPMSolver::SSPMSolver(SSPMSolver *this,Oink *oink,Game *game)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  
  Solver::Solver(&this->super_Solver,oink,game);
  auVar1 = ZEXT816(0) << 0x40;
  (this->super_Solver)._vptr_Solver = (_func_int **)&PTR__SSPMSolver_0019da10;
  this->pm_b = (bitset)ZEXT1632(auVar1);
  this->tmp_b = (bitset)ZEXT1632(auVar1);
  this->best_b = (bitset)ZEXT1632(auVar1);
  this->test_b = (bitset)ZEXT1632(auVar1);
  (this->Q).pointer = 0;
  (this->Q).queue = (uint *)0x0;
  this->lift_count = 0;
  this->lift_attempt = 0;
  this->bounded = false;
  auVar2 = SUB6432(ZEXT464(0) << 0x40,0);
  auVar3 = SUB6432(ZEXT464(0) << 0x40,0x20);
  (this->dirty)._bits = (uint64_t *)auVar2._0_8_;
  (this->dirty)._size = auVar2._8_8_;
  (this->dirty)._bitssize = auVar2._16_8_;
  (this->dirty)._allocsize = auVar2._24_8_;
  (this->unstable)._bits = (uint64_t *)auVar3._0_8_;
  (this->unstable)._size = auVar3._8_8_;
  (this->unstable)._bitssize = auVar3._16_8_;
  (this->unstable)._allocsize = auVar3._24_8_;
  return;
}

Assistant:

SSPMSolver::SSPMSolver(Oink& oink, Game& game) : Solver(oink, game)
{
}